

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyStrnicmp(char *zLeft,char *zRight,sxu32 SLen)

{
  byte bVar1;
  byte bVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  __int32_t _Var8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int local_48;
  int local_40;
  int local_38;
  
  if (zLeft != (char *)0x0) {
    if (zRight != (char *)0x0 && *zLeft != '\0') {
      if (*zRight == '\0') {
        return 1;
      }
      if (SLen == 0) {
        return 0;
      }
      local_38 = SLen - 1;
      local_40 = SLen - 2;
      local_48 = SLen - 3;
      lVar11 = 0;
      pbVar5 = (byte *)zRight;
      do {
        bVar1 = zLeft[lVar11];
        uVar6 = (ulong)bVar1;
        if (uVar6 == 0) {
          pbVar5 = (byte *)(zRight + lVar11);
          uVar6 = 0;
LAB_001158df:
          _Var8 = (__int32_t)uVar6;
          ppuVar3 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0) {
            pp_Var4 = __ctype_tolower_loc();
            _Var8 = (*pp_Var4)[uVar6];
          }
LAB_00115903:
          uVar6 = (ulong)*pbVar5;
          uVar9 = (uint)*pbVar5;
          if ((uVar6 < 0xc0) &&
             (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
            pp_Var4 = __ctype_tolower_loc();
            uVar9 = (*pp_Var4)[uVar6];
          }
          return _Var8 - uVar9;
        }
        bVar2 = zRight[lVar11];
        uVar12 = (ulong)bVar2;
        uVar9 = (uint)bVar2;
        if (uVar12 == 0) {
LAB_001158d9:
          _Var8 = (__int32_t)uVar6;
          if (0xbf < (byte)uVar6) goto LAB_00115903;
          goto LAB_001158df;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar7 = (*pp_Var4)[uVar6];
        }
        else {
          uVar7 = (uint)bVar1;
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar12 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar12];
        }
        if (uVar7 != uVar9) {
          pbVar5 = (byte *)(zRight + lVar11);
          goto LAB_001158d9;
        }
        iVar10 = (int)lVar11;
        if (local_38 == iVar10) {
          return 0;
        }
        bVar1 = zLeft[lVar11 + 1];
        uVar6 = (ulong)bVar1;
        uVar9 = (uint)bVar1;
        if (uVar6 == 0) {
          pbVar5 = (byte *)(zRight + lVar11 + 1);
LAB_001158c1:
          uVar6 = 0;
          goto LAB_001158df;
        }
        bVar2 = zRight[lVar11 + 1];
        uVar12 = (ulong)bVar2;
        uVar7 = (uint)bVar2;
        if (uVar12 == 0) {
          pbVar5 = (byte *)(zRight + lVar11 + 1);
          goto LAB_001158d9;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar6];
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar12 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar7 = (*pp_Var4)[uVar12];
        }
        if (uVar9 != uVar7) {
          pbVar5 = pbVar5 + 1;
          goto LAB_001158d9;
        }
        if (local_40 == iVar10) {
          return 0;
        }
        bVar1 = zLeft[lVar11 + 2];
        uVar6 = (ulong)bVar1;
        uVar9 = (uint)bVar1;
        if (uVar6 == 0) {
          pbVar5 = (byte *)(zRight + lVar11 + 2);
          goto LAB_001158c1;
        }
        bVar2 = zRight[lVar11 + 2];
        uVar12 = (ulong)bVar2;
        uVar7 = (uint)bVar2;
        if (uVar12 == 0) {
          pbVar5 = pbVar5 + 2;
          goto LAB_001158d9;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar6];
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar12 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar7 = (*pp_Var4)[uVar12];
        }
        if (uVar9 != uVar7) {
          pbVar5 = (byte *)(zRight + lVar11 + 2);
          goto LAB_001158d9;
        }
        if (local_48 == iVar10) {
          return 0;
        }
        bVar1 = zLeft[lVar11 + 3];
        uVar6 = (ulong)bVar1;
        uVar9 = (uint)bVar1;
        if (uVar6 == 0) {
          pbVar5 = (byte *)(zRight + lVar11 + 3);
          goto LAB_001158c1;
        }
        bVar2 = zRight[lVar11 + 3];
        uVar12 = (ulong)bVar2;
        uVar7 = (uint)bVar2;
        if (uVar12 == 0) {
          pbVar5 = (byte *)(zRight + lVar11 + 3);
          goto LAB_001158d9;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar6];
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar12 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar7 = (*pp_Var4)[uVar12];
        }
        if (uVar9 != uVar7) {
          pbVar5 = pbVar5 + 3;
          goto LAB_001158d9;
        }
        pbVar5 = pbVar5 + 4;
        lVar11 = lVar11 + 4;
        if (SLen == (sxu32)lVar11) {
          return 0;
        }
      } while( true );
    }
    if (*zLeft != '\0') {
      return 1;
    }
  }
  if (zRight == (char *)0x0) {
    return 0;
  }
  return -(uint)(*zRight != '\0');
}

Assistant:

JX9_PRIVATE sxi32 SyStrnicmp(const char *zLeft, const char *zRight, sxu32 SLen)
{
  	register unsigned char *p = (unsigned char *)zLeft;
	register unsigned char *q = (unsigned char *)zRight;
	
	if( SX_EMPTY_STR(p) || SX_EMPTY_STR(q) ){
		return SX_EMPTY_STR(p)? SX_EMPTY_STR(q) ? 0 : -1 :1;
	}
	for(;;){
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		
	}
	return (sxi32)(SyCharToLower(p[0]) - SyCharToLower(q[0]));
}